

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConeShape.cpp
# Opt level: O3

void __thiscall chrono::ChConeShape::ArchiveIN(ChConeShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChCone> specFuncA;
  undefined **local_38;
  ChCone *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChConeShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->gcone;
  local_28 = "gcone";
  local_18 = 0;
  local_38 = &PTR__ChFunctorArchiveIn_00b40d50;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChConeShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConeShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gcone);
}